

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

Array * __thiscall notch::core::Net::output(Net *this,Array *inputs)

{
  element_type *peVar1;
  bool bVar2;
  Array *pAVar3;
  pointer psVar4;
  ulong uVar5;
  ulong uVar6;
  
  selfCheck(this);
  peVar1 = (((this->layers).
             super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pAVar3 = (Array *)(**(code **)((long)peVar1->_vptr_ABackpropLayer + 0x60))(peVar1,inputs);
  psVar4 = (this->layers).
           super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x10 < (ulong)((long)(this->layers).
                           super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4)) {
    uVar5 = 1;
    uVar6 = 2;
    do {
      peVar1 = psVar4[uVar5].
               super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pAVar3 = (Array *)(**(code **)((long)peVar1->_vptr_ABackpropLayer + 0x60))(peVar1,pAVar3);
      psVar4 = (this->layers).
               super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)(this->layers).
                                    super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  return pAVar3;
}

Assistant:

const Array &output(const Array &inputs) {
        selfCheck();
        const Array *out = &(layers[0]->output(inputs));
        for (auto i = 1u; i < layers.size(); ++i) {
            out = &(layers[i]->output(*out));
        }
        return *out;
    }